

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnAtomicFenceExpr
          (BinaryReaderIR *this,uint32_t consistency_model)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_28;
  uint32_t local_1c;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  local_1c = consistency_model;
  std::make_unique<wabt::AtomicFenceExpr,unsigned_int&>((uint *)&local_28);
  local_18._M_head_impl = local_28;
  local_28 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_18);
  if (local_18._M_head_impl != (Expr *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_28 != (Expr *)0x0) {
    (*local_28->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnAtomicFenceExpr(uint32_t consistency_model) {
  return AppendExpr(std::make_unique<AtomicFenceExpr>(consistency_model));
}